

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int incomplete_type_p(c2m_ctx_t c2m_ctx,type *type)

{
  node_t_conflict pnVar1;
  node_t pnVar2;
  node_t_conflict pnVar3;
  bool bVar4;
  
LAB_0017c4d1:
  switch(type->mode) {
  case TM_BASIC:
    bVar4 = (type->u).basic_type == TP_VOID;
    goto LAB_0017c566;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    pnVar1 = (type->u).tag_type;
    pnVar2 = (pnVar1->u).ops.head;
    if (pnVar2 != (node_t)0x0) {
      pnVar2 = (pnVar2->op_link).next;
    }
    if (pnVar2->code != N_IGNORE) {
      pnVar3 = c2m_ctx->check_ctx->curr_scope;
      if (pnVar3 == (node_t_conflict)0x0) goto LAB_0017c553;
      goto LAB_0017c53c;
    }
    break;
  default:
    goto switchD_0017c4e7_caseD_3;
  case TM_ARR:
    if (((type->u).arr_type)->size->code != N_IGNORE) {
      type = ((type->u).arr_type)->el_type;
      goto LAB_0017c4d1;
    }
    break;
  case TM_FUNC:
    goto switchD_0017c4e7_caseD_7;
  }
  return 1;
switchD_0017c4e7_caseD_7:
  type = ((type->u).ptr_type)->arr_type;
  if (type == (type *)0x0) {
    return 1;
  }
  if ((type->mode == TM_BASIC) && ((type->u).basic_type == TP_VOID)) {
switchD_0017c4e7_caseD_3:
    return 0;
  }
  goto LAB_0017c4d1;
  while (pnVar3 = *(node_t_conflict *)((long)pnVar3->attr + 0x20), pnVar3 != (node_t_conflict)0x0) {
LAB_0017c53c:
    if ((pnVar3 == pnVar1) || (pnVar3 == c2m_ctx->top_scope)) break;
  }
LAB_0017c553:
  bVar4 = pnVar3 == pnVar1;
LAB_0017c566:
  return (int)bVar4;
}

Assistant:

static int incomplete_type_p (c2m_ctx_t c2m_ctx, struct type *type) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  switch (type->mode) {
  case TM_BASIC: return type->u.basic_type == TP_VOID;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: {
    node_t scope, n = type->u.tag_type;

    if (NL_EL (n->u.ops, 1)->code == N_IGNORE) return TRUE;
    for (scope = curr_scope; scope != NULL && scope != top_scope && scope != n;
         scope = ((struct node_scope *) scope->attr)->scope)
      ;
    return scope == n;
  }
  case TM_PTR: return FALSE;
  case TM_ARR: {
    struct arr_type *arr_type = type->u.arr_type;

    return (arr_type->size->code == N_IGNORE || incomplete_type_p (c2m_ctx, arr_type->el_type));
  }
  case TM_FUNC:
    return ((type = type->u.func_type->ret_type) == NULL
            || (!void_type_p (type) && incomplete_type_p (c2m_ctx, type)));
  default: return FALSE;
  }
}